

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyDB_LRU.cc
# Opt level: O1

void * __thiscall
MyDB_LRU::evictAndReplace
          (MyDB_LRU *this,pair<std::shared_ptr<MyDB_Table>,_long> *curId,MyDB_PageBase *page)

{
  map<std::pair<std::shared_ptr<MyDB_Table>,_long>,_Node_*,_std::less<std::pair<std::shared_ptr<MyDB_Table>,_long>_>,_std::allocator<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_Node_*>_>_>
  *this_00;
  MyDB_PageBase *this_01;
  Node *pNVar1;
  void *pvVar2;
  Node *pNVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_Node_*>_>,_std::_Rb_tree_iterator<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_Node_*>_>_>
  pVar4;
  pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_Node_*> local_50;
  
  pNVar3 = this->tail;
  do {
    pNVar3 = pNVar3->pre;
    this_01 = pNVar3->page;
  } while (this_01->isPined != false);
  pNVar1 = pNVar3->pre;
  pNVar1->next = pNVar3->next;
  pNVar3->next->pre = pNVar1;
  if ((this_01->slotId == -1) || (this_01->handleCount != 0)) {
    MyDB_PageBase::writeToDisk(this_01,this_01->addr);
  }
  this_00 = &this->LRUmap;
  pVar4 = std::
          _Rb_tree<std::pair<std::shared_ptr<MyDB_Table>,_long>,_std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_Node_*>,_std::_Select1st<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_Node_*>_>,_std::less<std::pair<std::shared_ptr<MyDB_Table>,_long>_>,_std::allocator<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_Node_*>_>_>
          ::equal_range(&this_00->_M_t,&pNVar3->page->pageId);
  std::
  _Rb_tree<std::pair<std::shared_ptr<MyDB_Table>,_long>,_std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_Node_*>,_std::_Select1st<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_Node_*>_>,_std::less<std::pair<std::shared_ptr<MyDB_Table>,_long>_>,_std::allocator<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_Node_*>_>_>
  ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node);
  pvVar2 = pNVar3->page->addr;
  pNVar3->page->addr = (void *)0x0;
  pNVar3->page = page;
  pNVar1 = this->head;
  pNVar3->next = pNVar1->next;
  pNVar3->pre = pNVar1;
  pNVar1->next->pre = pNVar3;
  pNVar1->next = pNVar3;
  local_50.first.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (curId->first).super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_50.first.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (curId->first).super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (local_50.first.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_50.first.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_50.first.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_50.first.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_50.first.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_50.first.second = curId->second;
  local_50.second = pNVar3;
  std::
  _Rb_tree<std::pair<std::shared_ptr<MyDB_Table>,long>,std::pair<std::pair<std::shared_ptr<MyDB_Table>,long>const,Node*>,std::_Select1st<std::pair<std::pair<std::shared_ptr<MyDB_Table>,long>const,Node*>>,std::less<std::pair<std::shared_ptr<MyDB_Table>,long>>,std::allocator<std::pair<std::pair<std::shared_ptr<MyDB_Table>,long>const,Node*>>>
  ::_M_insert_unique<std::pair<std::pair<std::shared_ptr<MyDB_Table>,long>const,Node*>>
            ((_Rb_tree<std::pair<std::shared_ptr<MyDB_Table>,long>,std::pair<std::pair<std::shared_ptr<MyDB_Table>,long>const,Node*>,std::_Select1st<std::pair<std::pair<std::shared_ptr<MyDB_Table>,long>const,Node*>>,std::less<std::pair<std::shared_ptr<MyDB_Table>,long>>,std::allocator<std::pair<std::pair<std::shared_ptr<MyDB_Table>,long>const,Node*>>>
              *)this_00,&local_50);
  if (local_50.first.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.first.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return pvVar2;
}

Assistant:

void* MyDB_LRU:: evictAndReplace(pair<MyDB_TablePtr, long> curId, MyDB_PageBase* page) {

    Node* node = this -> tail -> pre;
    while (node -> page -> isPined == true) {
        node = node->pre;
    }
    node -> pre -> next = node -> next;
    node -> next -> pre = node -> pre;

    // consider if write the data back to the disk
    // if this page is a normal page
    if (node -> page -> slotId == -1) {
        node -> page -> writeToDisk(node -> page -> addr);

    }
    // if this page is anonymous page
    else {
        if (node -> page -> handleCount != 0) {
            node -> page -> writeToDisk(node -> page -> addr);
        }
    }

    this -> LRUmap.erase(node -> page -> pageId);

    void* res = node -> page -> addr;
    node -> page -> addr = nullptr;
    //delete node;
    node -> page = page;
    node -> next = this -> head -> next;
    node -> pre = this -> head;
    this -> head -> next -> pre = node;
    this -> head -> next = node;

    this -> LRUmap.insert(map<pair<MyDB_TablePtr, long>, Node*>::value_type(curId, node));
    return res;
}